

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O0

uint RDL_bitset_compressed(uchar **compressed,char *edges,uint size)

{
  uint uVar1;
  uint local_24;
  uint i;
  uint new_size;
  uint size_local;
  char *edges_local;
  uchar **compressed_local;
  
  uVar1 = RDL_bitset_init(compressed,size);
  for (local_24 = 0; local_24 < size; local_24 = local_24 + 1) {
    if (edges[local_24] != '\0') {
      RDL_bitset_set(*compressed,local_24);
    }
  }
  return uVar1;
}

Assistant:

unsigned RDL_bitset_compressed(unsigned char** compressed, const char* edges, unsigned size)
{
  unsigned new_size, i;

  new_size = RDL_bitset_init(compressed, size);

  for (i = 0; i < size; ++i) {
    if (edges[i]) {
      RDL_bitset_set(*compressed, i);
    }
  }

  return new_size;
}